

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 clamp(int x)

{
  uint uVar1;
  int x_local;
  
  uVar1 = x + 0x80;
  if (0xff < uVar1) {
    if ((int)uVar1 < 0) {
      return '\0';
    }
    if (0xff < (int)uVar1) {
      return 0xff;
    }
  }
  return (uint8)uVar1;
}

Assistant:

__forceinline static uint8 clamp(int x)
{
   x += 128;
   // trick to use a single test to catch both cases
   if ((unsigned int) x > 255) {
      if (x < 0) return 0;
      if (x > 255) return 255;
   }
   return (uint8) x;
}